

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateGetSingleCharString
          (Lowerer *this,RegOpnd *charCodeOpnd,Opnd *resultOpnd,LabelInstr *labelHelper,
          LabelInstr *doneLabel,Instr *instr,bool isCodePoint)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  BYTE scale;
  DWORD DVar4;
  DWORD DVar5;
  LabelInstr *target;
  undefined4 *puVar6;
  Opnd *pOVar7;
  IntConstOpnd *compareSrc2;
  IndirOpnd *src;
  HelperCallOpnd *src1Opnd;
  Instr *instr_00;
  Instr *helperCallInstr;
  JnHelperMethod helperMethod;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseCacheRegOpnd;
  RegOpnd *cacheRegOpnd;
  LabelInstr *labelWCharStringCheck;
  bool isCodePoint_local;
  Instr *instr_local;
  LabelInstr *doneLabel_local;
  LabelInstr *labelHelper_local;
  Opnd *resultOpnd_local;
  RegOpnd *charCodeOpnd_local;
  Lowerer *this_local;
  
  target = IR::LabelInstr::New(Label,this->m_func,false);
  autoReuseCacheRegOpnd._16_8_ = IR::RegOpnd::New(TyVar,instr->m_func);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_68,(Opnd *)autoReuseCacheRegOpnd._16_8_,instr->m_func,true);
  DVar4 = Js::JavascriptLibrary::GetCharStringCacheAOffset();
  DVar5 = Js::JavascriptLibrary::GetCharStringCacheOffset();
  if (DVar4 != DVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e29,
                       "(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset())"
                       ,
                       "Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar2 = autoReuseCacheRegOpnd._16_8_;
  pOVar7 = LoadLibraryValueOpnd(this,instr,ValueCharStringCache);
  InsertMove((Opnd *)uVar2,pOVar7,instr,true);
  compareSrc2 = IR::IntConstOpnd::New(0x80,TyUint32,this->m_func,false);
  InsertCompareBranch(this,&charCodeOpnd->super_Opnd,&compareSrc2->super_Opnd,BrGe_A,true,target,
                      instr,false);
  uVar2 = autoReuseCacheRegOpnd._16_8_;
  scale = LowererMD::GetDefaultIndirScale();
  src = IR::IndirOpnd::New((RegOpnd *)uVar2,charCodeOpnd,scale,TyVar,instr->m_func);
  InsertMove(resultOpnd,&src->super_Opnd,instr,true);
  InsertTestBranch(resultOpnd,resultOpnd,BrEq_A,labelHelper,instr);
  pOVar7 = IR::Instr::GetDst(instr);
  InsertMove(pOVar7,resultOpnd,instr,true);
  InsertBranch(Br,doneLabel,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  if (isCodePoint) {
    helperCallInstr._0_4_ = HelperGetStringForCharCodePoint;
  }
  else {
    pOVar7 = IR::Opnd::UseWithNewType(&charCodeOpnd->super_Opnd,TyUint16,instr->m_func);
    InsertMove(&charCodeOpnd->super_Opnd,pOVar7,instr,true);
    helperCallInstr._0_4_ = HelperGetStringForChar;
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&charCodeOpnd->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)autoReuseCacheRegOpnd._16_8_);
  src1Opnd = IR::HelperCallOpnd::New((JnHelperMethod)helperCallInstr,this->m_func);
  instr_00 = IR::Instr::New(Call,resultOpnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::LowerCall(&this->m_lowererMD,instr_00,0);
  pOVar7 = IR::Instr::GetDst(instr);
  InsertMove(pOVar7,resultOpnd,instr,true);
  InsertBranch(Br,doneLabel,instr);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return;
}

Assistant:

void
Lowerer::GenerateGetSingleCharString(IR::RegOpnd * charCodeOpnd, IR::Opnd * resultOpnd, IR::LabelInstr * labelHelper, IR::LabelInstr * doneLabel, IR::Instr * instr, bool isCodePoint)
{
    //      MOV cacheReg, CharStringCache
    //      CMP charCodeOpnd, Js::ScriptContext::CharStringCacheSize
    //      JAE $labelWCharStringCheck                                   <
    //      MOV resultOpnd, cacheReg[charCodeOpnd]
    //      TST resultOpnd, resultOpnd          //Check for null
    //      JEQ $helper
    //      JMP $Done
    //
    //$labelWCharStringCheck:
    //            Arg1 =  charCodeOpnd
    //            Arg0 =  cacheReg
    //      resultOpnd =  Call HelperGetStringForCharW/CodePoint
    //      JMP $Done
    //$helper:

    IR::LabelInstr *labelWCharStringCheck = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    //Try to load from in  CharStringCacheA
    IR::RegOpnd *cacheRegOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
    IR::AutoReuseOpnd autoReuseCacheRegOpnd(cacheRegOpnd, instr->m_func);

    Assert(Js::JavascriptLibrary::GetCharStringCacheAOffset() == Js::JavascriptLibrary::GetCharStringCacheOffset());
    InsertMove(cacheRegOpnd, this->LoadLibraryValueOpnd(instr, LibraryValue::ValueCharStringCache), instr);

    InsertCompareBranch(charCodeOpnd, IR::IntConstOpnd::New(Js::CharStringCache::CharStringCacheSize, TyUint32, this->m_func), Js::OpCode::BrGe_A, true, labelWCharStringCheck, instr);
    InsertMove(resultOpnd, IR::IndirOpnd::New(cacheRegOpnd, charCodeOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyVar, instr->m_func), instr);

    InsertTestBranch(resultOpnd, resultOpnd, Js::OpCode::BrEq_A, labelHelper, instr);

    InsertMove(instr->GetDst(), resultOpnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);

    instr->InsertBefore(labelWCharStringCheck);

    IR::JnHelperMethod helperMethod;
    if (isCodePoint)
    {
        helperMethod = IR::HelperGetStringForCharCodePoint;
    }
    else
    {
        InsertMove(charCodeOpnd, charCodeOpnd->UseWithNewType(TyUint16, instr->m_func), instr);
        helperMethod = IR::HelperGetStringForChar;
    }

    //Try to load from in  CharStringCacheW or CharStringCacheCodePoint, this is a helper call.

    this->m_lowererMD.LoadHelperArgument(instr, charCodeOpnd);
    this->m_lowererMD.LoadHelperArgument(instr, cacheRegOpnd);
    IR::Instr* helperCallInstr = IR::Instr::New(Js::OpCode::Call, resultOpnd, IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
    instr->InsertBefore(helperCallInstr);
    this->m_lowererMD.LowerCall(helperCallInstr, 0);

    InsertMove(instr->GetDst(), resultOpnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
}